

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QPoint *pos)

{
  Picker *this_00;
  ItemFlags IVar1;
  QModelIndex index;
  QModelIndex local_50;
  QArrayDataPointer<char16_t> local_38;
  
  indexForPos(&local_50,this,pos);
  if (((-1 < local_50.r) && (-1 < local_50.c)) && (local_50.m != (QAbstractItemModel *)0x0)) {
    IVar1 = QModelIndex::flags(&local_50);
    if ((IVar1.i & 0x20) != 0) {
      setCurrentIndex(this,&local_50);
      this_00 = this->q;
      itemText((QString *)&local_38,this,&local_50);
      Picker::activated(this_00,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      Picker::activated(this->q,local_50.r);
    }
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QPoint & pos )
{
	const QModelIndex index = indexForPos( pos );

	if( index.isValid() && ( index.flags() & Qt::ItemIsEnabled ) )
	{
		setCurrentIndex( index );
		emit q->activated( itemText( index ) );
		emit q->activated( index.row() );
	}
}